

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateRootLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int count,
          double *outSumLogLikelihood)

{
  _func_int **pp_Var1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  if (count != 1) {
    iVar4 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x4b])(this);
    return iVar4;
  }
  uVar3 = 0;
  if (-1 < (char)this->kFlags) {
    if (((uint)this->kFlags >> 8 & 1) == 0) {
      uVar3 = *cumulativeScaleIndices;
    }
    else {
      uVar3 = *bufferIndices - this->kTipCount;
    }
  }
  pp_Var1 = (this->super_BeagleImpl)._vptr_BeagleImpl;
  if (this->kAutoRootPartitioningEnabled == true) {
    (*pp_Var1[0x49])(this);
    *outSumLogLikelihood = 0.0;
    dVar6 = 0.0;
    iVar4 = this->kPartitionCount;
    pdVar2 = this->gAutoPartitionOutSumLogLikelihoods;
    for (lVar5 = 0; lVar5 < iVar4; lVar5 = lVar5 + 1) {
      dVar6 = dVar6 + pdVar2[lVar5];
      *outSumLogLikelihood = dVar6;
    }
    return (uint)!NAN(dVar6) * 8 + -8;
  }
  if (-1 < *categoryWeightsIndices) {
    iVar4 = (*pp_Var1[0x46])(this);
    return iVar4;
  }
  iVar4 = (*pp_Var1[0x47])(this,(ulong)(uint)*bufferIndices,(ulong)(uint)*stateFrequenciesIndices,
                           (ulong)uVar3,outSumLogLikelihood,pp_Var1[0x47]);
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateRootLogLikelihoods(const int *bufferIndices,
                                                                       const int *categoryWeightsIndices,
                                                                       const int *stateFrequenciesIndices,
                                                                       const int *cumulativeScaleIndices,
                                                                       int count,
                                                                       double *outSumLogLikelihood) {

    if (count == 1) {
        // We treat this as a special case so that we don't have convoluted logic
        //      at the end of the loop over patterns
        int cumulativeScalingFactorIndex;
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            cumulativeScalingFactorIndex = 0;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            cumulativeScalingFactorIndex = bufferIndices[0] - kTipCount;
        } else {
            cumulativeScalingFactorIndex = cumulativeScaleIndices[0];
        }

        if (kAutoRootPartitioningEnabled) {
            calcRootLogLikelihoodsByAutoPartitionAsync(bufferIndices,
                                                       categoryWeightsIndices,
                                                       stateFrequenciesIndices,
                                                       cumulativeScaleIndices,
                                                       gAutoPartitionIndices,
                                                       gAutoPartitionOutSumLogLikelihoods);

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < kPartitionCount; i++) {
                *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood) {
                return BEAGLE_ERROR_FLOATING_POINT;
            } else {
                return BEAGLE_SUCCESS;
            }
        } else {

            if (categoryWeightsIndices[0] >= 0) {
                return calcRootLogLikelihoods(bufferIndices[0], categoryWeightsIndices[0], stateFrequenciesIndices[0],
                                              cumulativeScalingFactorIndex, outSumLogLikelihood);
            } else {
                return calcRootLogLikelihoodsPerCategory(
                        bufferIndices[0], stateFrequenciesIndices[0], cumulativeScalingFactorIndex, outSumLogLikelihood);
            }
        }
    } else {
        return calcRootLogLikelihoodsMulti(bufferIndices, categoryWeightsIndices, stateFrequenciesIndices,
                                           cumulativeScaleIndices, count, outSumLogLikelihood);
    }
}